

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void P_SpawnSpecials(void)

{
  line_t_conflict *line_00;
  double dVar1;
  uint uVar2;
  extsector_t *this;
  line_t_conflict *plVar3;
  int iVar4;
  uint uVar5;
  DThinker *origin;
  DWallLightTransfer *this_00;
  DLightTransfer *pDVar6;
  bool tolines;
  ushort uVar7;
  sector_t_conflict *psVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  undefined8 in_RSI;
  sector_t_conflict *psVar12;
  line_t_conflict *line;
  double dVar13;
  FSectorTagIterator itr;
  TThinkerIterator<ASkyCamCompat> it2;
  DVector2 local_68;
  double local_50;
  FThinkerIterator local_48;
  
  P_SetupPortals();
  if (0 < numsectors) {
    iVar10 = 0;
    psVar8 = sectors;
    do {
      if (psVar8->special != 0) {
        P_InitSectorSpecial((sector_t *)psVar8,(int)in_RSI);
      }
      iVar10 = iVar10 + 1;
      psVar8 = psVar8 + 1;
    } while (iVar10 < numsectors);
  }
  ProcessEDSectors();
  P_SpawnScrollers();
  if (0 < numlines) {
    piVar9 = lines->args + 1;
    iVar10 = 0;
    do {
      if (piVar9[-2] == 0xdb) {
        iVar4 = *piVar9;
        if (iVar4 == 0) {
          dVar13 = c_sqrt(*(double *)(piVar9 + -6) * *(double *)(piVar9 + -6) +
                          ((DVector2 *)(piVar9 + -8))->X * ((DVector2 *)(piVar9 + -8))->X);
          iVar4 = (int)dVar13;
        }
        else if (199 < iVar4) {
          iVar4 = 200;
        }
        P_SetSectorFriction(piVar9[-1],iVar4,false);
        piVar9[-2] = 0;
      }
      iVar10 = iVar10 + 1;
      piVar9 = piVar9 + 0x26;
    } while (iVar10 < numlines);
  }
  P_SpawnPushers();
  FThinkerIterator::FThinkerIterator(&local_48,ASkyCamCompat::RegistrationInfo.MyClass,0x80);
  origin = FThinkerIterator::Next(&local_48,false);
  if (origin != (DThinker *)0x0) {
    do {
      P_SpawnSkybox((ASkyViewpoint *)origin);
      origin = FThinkerIterator::Next(&local_48,false);
    } while (origin != (DThinker *)0x0);
  }
  if (0 < numlines) {
    lVar11 = 0;
    do {
      plVar3 = lines;
      line_00 = lines + lVar11;
      iVar10 = lines[lVar11].special;
      if (iVar10 < 0x9c) {
        if (iVar10 < 0x33) {
          if (iVar10 == 0x10) {
            this_00 = (DWallLightTransfer *)
                      M_Malloc_Dbg(0x48,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DWallLightTransfer::DWallLightTransfer
                      (this_00,(sector_t *)lines[lVar11].frontsector,lines[lVar11].args[0],
                       (BYTE)lines[lVar11].args[1]);
          }
          else if (iVar10 == 0x30) {
            P_Attach3dMidtexLinesToSector
                      (line_00->frontsector,line_00->args[0],line_00->args[1],line_00->args[2] != 0)
            ;
          }
        }
        else if (iVar10 == 0x33) {
          if (line_00->args[0] == 0) {
            P_AddSectorLinks(line_00->frontsector,line_00->args[1],line_00->args[2],line_00->args[3]
                            );
          }
        }
        else if (iVar10 == 0x39) {
          iVar10 = line_00->args[1];
          if (((iVar10 == 6) || (iVar10 == 0)) && (line_00->args[3] == 0)) {
            P_SpawnPortal(line_00,line_00->args[0],line_00->args[2],line_00->args[4],iVar10);
          }
          else if (lines[lVar11].args[1] - 3U < 2) {
            local_68.X = 0.0;
            local_68.Y = 0.0;
            tolines = false;
            uVar5 = P_GetPortal(iVar10 == 3 ^ 5,line_00->args[2],line_00->frontsector,
                                (sector_t_conflict *)0x0,&local_68);
            CopyPortal(line_00->args[0],line_00->args[2],uVar5,0.0,tolines);
          }
        }
      }
      else if (iVar10 < 0xd1) {
        if (iVar10 == 0x9c) {
          P_SpawnLinePortal(line_00);
        }
        else if (iVar10 == 0xbe) {
          iVar10 = line_00->args[1];
          if (iVar10 < 3) {
            if (iVar10 == 0) {
              dVar13 = (line_00->delta).X;
              dVar1 = (line_00->delta).Y;
              local_50 = c_sqrt(dVar1 * dVar1 + dVar13 * dVar13);
              local_50 = local_50 / 100.0;
              iVar10 = lines[lVar11].args[0];
              if (iVar10 == 0) {
                iVar4 = 0;
              }
              else {
                iVar4 = tagManager.TagHashFirst[(byte)iVar10];
              }
              local_68.X = (double)CONCAT44(iVar4,iVar10);
              uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              while (-1 < (int)uVar5) {
                sectors[uVar5].gravity = local_50;
                uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              }
            }
            else if (iVar10 == 2) {
              dVar13 = (line_00->delta).X;
              dVar1 = (line_00->delta).Y;
              local_50 = c_sqrt(dVar1 * dVar1 + dVar13 * dVar13);
              iVar10 = lines[lVar11].args[0];
              if (iVar10 == 0) {
                iVar4 = 0;
              }
              else {
                iVar4 = tagManager.TagHashFirst[(byte)iVar10];
              }
              local_68.X = (double)CONCAT44(iVar4,iVar10);
              uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              if (-1 < (int)uVar5) {
                iVar10 = (int)local_50;
                do {
                  psVar8 = sectors;
                  sectors[uVar5].damageamount = iVar10;
                  psVar8[uVar5].damagetype.super_FName.Index = 0;
                  if (iVar10 < 0x14) {
                    psVar8[uVar5].damageinterval = 0x20;
                    psVar8[uVar5].leakydamage = 0;
                  }
                  else if (iVar10 < 0x32) {
                    psVar8[uVar5].damageinterval = 0x20;
                    psVar8[uVar5].leakydamage = 5;
                  }
                  else {
                    psVar8[uVar5].damageinterval = 1;
                    psVar8[uVar5].leakydamage = 0x100;
                  }
                  uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
                } while (-1 < (int)uVar5);
              }
            }
          }
          else if (iVar10 == 3) {
            if (line_00->args[3] == 0) {
              P_AddSectorLinksByID(line_00->frontsector,line_00->args[0],line_00->args[2]);
            }
          }
          else if (iVar10 == 0xff) {
            iVar10 = lines[lVar11].args[0];
            if (iVar10 == 0) {
              iVar4 = 0;
            }
            else {
              iVar4 = tagManager.TagHashFirst[(byte)iVar10];
            }
            local_68.X = (double)CONCAT44(iVar4,iVar10);
            uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
            if (-1 < (int)uVar5) {
              do {
                sectors[uVar5].sky = (int)lVar11 + 1U | 0x40000000;
                uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              } while (-1 < (int)uVar5);
            }
          }
        }
      }
      else if (iVar10 == 0xd3) {
        pDVar6 = (DLightTransfer *)
                 M_Malloc_Dbg(0x48,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
        DLightTransfer::DLightTransfer
                  (pDVar6,(sector_t *)lines[lVar11].frontsector,lines[lVar11].args[0],false);
      }
      else if (iVar10 == 0xd2) {
        pDVar6 = (DLightTransfer *)
                 M_Malloc_Dbg(0x48,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
        DLightTransfer::DLightTransfer
                  (pDVar6,(sector_t *)lines[lVar11].frontsector,lines[lVar11].args[0],true);
      }
      else if (iVar10 == 0xd1) {
        psVar8 = line_00->frontsector;
        if ((line_00->args[1] & 2) != 0) {
          *(byte *)&psVar8->MoreFlags = (byte)psVar8->MoreFlags | 2;
        }
        uVar5 = plVar3[lVar11].args[1];
        if ((uVar5 & 4) != 0) {
          *(byte *)&psVar8->MoreFlags = (byte)psVar8->MoreFlags | 4;
        }
        uVar7 = 0x20;
        if (((uVar5 & 8) != 0) || (uVar7 = 0x40, forcewater.Value == true)) {
          psVar8->MoreFlags = psVar8->MoreFlags | uVar7;
        }
        if ((uVar5 & 0x10) != 0) {
          *(byte *)&psVar8->MoreFlags = (byte)psVar8->MoreFlags | 0x10;
        }
        if ((uVar5 & 0x20) != 0) {
          *(byte *)&psVar8->MoreFlags = (byte)psVar8->MoreFlags | 8;
        }
        iVar10 = plVar3[lVar11].args[0];
        if (iVar10 == 0) {
          iVar4 = 0;
        }
        else {
          iVar4 = tagManager.TagHashFirst[(byte)iVar10];
        }
        local_68.X = (double)CONCAT44(iVar4,iVar10);
        while (uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68), -1 < (int)uVar5) {
          sectors[uVar5].heightsec = psVar8;
          this = psVar8->e;
          psVar12 = sectors + uVar5;
          TArray<sector_t_*,_sector_t_*>::Grow((TArray<sector_t_*,_sector_t_*> *)this,1);
          uVar2 = (this->FakeFloor).Sectors.Count;
          (this->FakeFloor).Sectors.Array[uVar2] = psVar12;
          (this->FakeFloor).Sectors.Count = uVar2 + 1;
          sector_t::AdjustFloorClip((sector_t *)(sectors + uVar5));
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < numlines);
  }
  FBehavior::StaticStartTypedScripts(1,(AActor *)0x0,false,0,false);
  return;
}

Assistant:

void P_SpawnSpecials (void)
{
	sector_t *sector;
	int i;

	P_SetupPortals();

	//	Init special SECTORs.
	sector = sectors;
	for (i = 0; i < numsectors; i++, sector++)
	{
		if (sector->special == 0)
			continue;

		P_InitSectorSpecial(sector, sector->special);
	}

#ifndef NO_EDATA
	ProcessEDSectors();
#endif

	
	// Init other misc stuff

	P_SpawnScrollers(); // killough 3/7/98: Add generalized scrollers
	P_SpawnFriction();	// phares 3/12/98: New friction model using linedefs
	P_SpawnPushers();	// phares 3/20/98: New pusher model using linedefs

	TThinkerIterator<ASkyCamCompat> it2;
	ASkyCamCompat *pt2;
	while ((pt2 = it2.Next()))
	{
		P_SpawnSkybox(pt2);
	}

	for (i = 0; i < numlines; i++)
	{
		switch (lines[i].special)
		{
			int s;
			sector_t *sec;

		// killough 3/7/98:
		// support for drawn heights coming from different sector
		case Transfer_Heights:
			{
				sec = lines[i].frontsector;
				if (lines[i].args[1] & 2)
				{
					sec->MoreFlags |= SECF_FAKEFLOORONLY;
				}
				if (lines[i].args[1] & 4)
				{
					sec->MoreFlags |= SECF_CLIPFAKEPLANES;
				}
				if (lines[i].args[1] & 8)
				{
					sec->MoreFlags |= SECF_UNDERWATER;
				}
				else if (forcewater)
				{
					sec->MoreFlags |= SECF_FORCEDUNDERWATER;
				}
				if (lines[i].args[1] & 16)
				{
					sec->MoreFlags |= SECF_IGNOREHEIGHTSEC;
				}
				if (lines[i].args[1] & 32)
				{
					sec->MoreFlags |= SECF_NOFAKELIGHT;
				}
				FSectorTagIterator itr(lines[i].args[0]);
				while ((s = itr.Next()) >= 0)
				{
					sectors[s].heightsec = sec;
					sec->e->FakeFloor.Sectors.Push(&sectors[s]);
					sectors[s].AdjustFloorClip();
				}
				break;
			}

		// killough 3/16/98: Add support for setting
		// floor lighting independently (e.g. lava)
		case Transfer_FloorLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], true);
			break;

		// killough 4/11/98: Add support for setting
		// ceiling lighting independently
		case Transfer_CeilingLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], false);
			break;

		// [Graf Zahl] Add support for setting lighting
		// per wall independently
		case Transfer_WallLight:
			new DWallLightTransfer (lines[i].frontsector, lines[i].args[0], lines[i].args[1]);
			break;

		case Sector_Attach3dMidtex:
			P_Attach3dMidtexLinesToSector(lines[i].frontsector, lines[i].args[0], lines[i].args[1], !!lines[i].args[2]);
			break;

		case Sector_SetLink:
			if (lines[i].args[0] == 0)
			{
				P_AddSectorLinks(lines[i].frontsector, lines[i].args[1], lines[i].args[2], lines[i].args[3]);
			}
			break;

		case Sector_SetPortal:
			// arg 0 = sector tag
			// arg 1 = type
			//	- 0: normal (handled here)
			//	- 1: copy (handled by the portal they copy)
			//	- 2: EE-style skybox (handled by the camera object)
			//  - 3: EE-style flat portal (GZDoom HW renderer only for now)
			//  - 4: EE-style horizon portal (GZDoom HW renderer only for now)
			//  - 5: copy portal to line (GZDoom HW renderer only for now)
			//  - 6: linked portal
			//	other values reserved for later use
			// arg 2 = 0:floor, 1:ceiling, 2:both
			// arg 3 = 0: anchor, 1: reference line
			// arg 4 = for the anchor only: alpha
			if ((lines[i].args[1] == 0 || lines[i].args[1] == 6) && lines[i].args[3] == 0)
			{
				P_SpawnPortal(&lines[i], lines[i].args[0], lines[i].args[2], lines[i].args[4], lines[i].args[1]);
			}
			else if (lines[i].args[1] == 3 || lines[i].args[1] == 4)
			{
				line_t *line = &lines[i];
				unsigned pnum = P_GetPortal(line->args[1] == 3 ? PORTS_PLANE : PORTS_HORIZON, line->args[2], line->frontsector, NULL, { 0,0 });
				CopyPortal(line->args[0], line->args[2], pnum, 0, true);
			}
			break;

		case Line_SetPortal:
			P_SpawnLinePortal(&lines[i]);
			break;

		// [RH] ZDoom Static_Init settings
		case Static_Init:
			switch (lines[i].args[1])
			{
			case Init_Gravity:
				{
					double grav = lines[i].Delta().Length() / 100.;
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						sectors[s].gravity = grav;
				}
				break;

			//case Init_Color:
			// handled in P_LoadSideDefs2()

			case Init_Damage:
				{
					int damage = int(lines[i].Delta().Length());
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
					{
						sector_t *sec = &sectors[s];
						sec->damageamount = damage;
						sec->damagetype = NAME_None;
						if (sec->damageamount < 20)
						{
							sec->leakydamage = 0;
							sec->damageinterval = 32;
						}
						else if (sec->damageamount < 50)
						{
							sec->leakydamage = 5;
							sec->damageinterval = 32;
						}
						else
						{
							sec->leakydamage = 256;
							sec->damageinterval = 1;
						}
					}
				}
				break;

			case Init_SectorLink:
				if (lines[i].args[3] == 0)
					P_AddSectorLinksByID(lines[i].frontsector, lines[i].args[0], lines[i].args[2]);
				break;

			// killough 10/98:
			//
			// Support for sky textures being transferred from sidedefs.
			// Allows scrolling and other effects (but if scrolling is
			// used, then the same sector tag needs to be used for the
			// sky sector, the sky-transfer linedef, and the scroll-effect
			// linedef). Still requires user to use F_SKY1 for the floor
			// or ceiling texture, to distinguish floor and ceiling sky.

			case Init_TransferSky:
				{
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						 sectors[s].sky = (i + 1) | PL_SKYFLAT; 
					break;
				}
			}
			break;
		}
	}
	// [RH] Start running any open scripts on this map
	FBehavior::StaticStartTypedScripts (SCRIPT_Open, NULL, false);
}